

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_statistics.cpp
# Opt level: O2

void __thiscall duckdb::TableStatistics::MergeStats(TableStatistics *this,TableStatistics *other)

{
  unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true> *this_00;
  unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true> *this_01;
  _Head_base<0UL,_duckdb::BlockingSample_*,_false> _Var1;
  _Head_base<0UL,_duckdb::BlockingSample_*,_false> _Var2;
  pointer pBVar3;
  ReservoirSample *pRVar4;
  reference pvVar5;
  ColumnStatistics *this_02;
  type other_00;
  idx_t i;
  ulong __n;
  unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>,_true> l;
  _Head_base<0UL,_duckdb::BlockingSample_*,_false> local_40;
  _Head_base<0UL,_duckdb::BlockingSample_*,_false> local_38;
  unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>_>
  local_30;
  
  GetLock((TableStatistics *)&local_30);
  this_00 = &this->table_sample;
  this_01 = &other->table_sample;
  _Var1._M_head_impl =
       (other->table_sample).
       super_unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>._M_t.
       super___uniq_ptr_impl<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::BlockingSample_*,_std::default_delete<duckdb::BlockingSample>_>
       .super__Head_base<0UL,_duckdb::BlockingSample_*,_false>._M_head_impl;
  if ((this->table_sample).
      super_unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>._M_t.
      super___uniq_ptr_impl<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::BlockingSample_*,_std::default_delete<duckdb::BlockingSample>_>
      .super__Head_base<0UL,_duckdb::BlockingSample_*,_false>._M_head_impl == (BlockingSample *)0x0)
  {
    if (_Var1._M_head_impl != (BlockingSample *)0x0) {
      pBVar3 = unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true>
               ::operator->(this_01);
      pRVar4 = BlockingSample::Cast<duckdb::ReservoirSample>(pBVar3);
      (*(pRVar4->super_BlockingSample)._vptr_BlockingSample[3])(&local_38,pRVar4);
      _Var2._M_head_impl = local_38._M_head_impl;
      local_38._M_head_impl = (BlockingSample *)0x0;
      _Var1._M_head_impl =
           (this_00->
           super_unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>).
           _M_t.
           super___uniq_ptr_impl<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::BlockingSample_*,_std::default_delete<duckdb::BlockingSample>_>
           .super__Head_base<0UL,_duckdb::BlockingSample_*,_false>._M_head_impl;
      (this_00->
      super_unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>)._M_t.
      super___uniq_ptr_impl<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::BlockingSample_*,_std::default_delete<duckdb::BlockingSample>_>
      .super__Head_base<0UL,_duckdb::BlockingSample_*,_false>._M_head_impl = _Var2._M_head_impl;
      if (_Var1._M_head_impl != (BlockingSample *)0x0) {
        (**(code **)((long)(_Var1._M_head_impl)->_vptr_BlockingSample + 8))();
        if (local_38._M_head_impl != (BlockingSample *)0x0) {
          (*(local_38._M_head_impl)->_vptr_BlockingSample[1])();
        }
      }
    }
  }
  else if (_Var1._M_head_impl != (BlockingSample *)0x0) {
    pBVar3 = unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true>::
             operator->(this_00);
    pRVar4 = BlockingSample::Cast<duckdb::ReservoirSample>(pBVar3);
    local_40._M_head_impl =
         (this_01->
         super_unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>).
         _M_t.
         super___uniq_ptr_impl<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::BlockingSample_*,_std::default_delete<duckdb::BlockingSample>_>
         .super__Head_base<0UL,_duckdb::BlockingSample_*,_false>._M_head_impl;
    (this_01->super_unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>
    )._M_t.
    super___uniq_ptr_impl<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>._M_t
    .super__Tuple_impl<0UL,_duckdb::BlockingSample_*,_std::default_delete<duckdb::BlockingSample>_>.
    super__Head_base<0UL,_duckdb::BlockingSample_*,_false>._M_head_impl = (BlockingSample *)0x0;
    ReservoirSample::Merge
              (pRVar4,(unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true>
                       *)&local_40);
    if (local_40._M_head_impl != (BlockingSample *)0x0) {
      (*(local_40._M_head_impl)->_vptr_BlockingSample[1])();
    }
    local_40._M_head_impl = (BlockingSample *)0x0;
  }
  for (__n = 0; __n < (ulong)((long)(this->column_stats).
                                    super_vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
                                    .
                                    super__Vector_base<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->column_stats).
                                    super_vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
                                    .
                                    super__Vector_base<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 4); __n = __n + 1)
  {
    pvVar5 = vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_true>::get<true>
                       (&this->column_stats,__n);
    if ((pvVar5->internal).super___shared_ptr<duckdb::ColumnStatistics,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)0x0) {
      pvVar5 = vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_true>::get<true>
                         (&this->column_stats,__n);
      this_02 = shared_ptr<duckdb::ColumnStatistics,_true>::operator->(pvVar5);
      pvVar5 = vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_true>::get<true>
                         (&other->column_stats,__n);
      other_00 = shared_ptr<duckdb::ColumnStatistics,_true>::operator*(pvVar5);
      ColumnStatistics::Merge(this_02,other_00);
    }
  }
  ::std::unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>_>
  ::~unique_ptr(&local_30);
  return;
}

Assistant:

void TableStatistics::MergeStats(TableStatistics &other) {
	auto l = GetLock();
	D_ASSERT(column_stats.size() == other.column_stats.size());
	if (table_sample) {
		if (other.table_sample) {
			D_ASSERT(table_sample->type == SampleType::RESERVOIR_SAMPLE);
			auto &this_reservoir = table_sample->Cast<ReservoirSample>();
			D_ASSERT(other.table_sample->type == SampleType::RESERVOIR_SAMPLE);
			this_reservoir.Merge(std::move(other.table_sample));
		}
		// if no other.table sample, do nothig
	} else {
		if (other.table_sample) {
			auto &other_reservoir = other.table_sample->Cast<ReservoirSample>();
			auto other_table_sample_copy = other_reservoir.Copy();
			table_sample = std::move(other_table_sample_copy);
		}
	}
	for (idx_t i = 0; i < column_stats.size(); i++) {
		if (column_stats[i]) {
			D_ASSERT(other.column_stats[i]);
			column_stats[i]->Merge(*other.column_stats[i]);
		}
	}
}